

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int ssl_handshake_init(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_session **ppmVar1;
  mbedtls_ssl_config *pmVar2;
  mbedtls_ssl_transform *pmVar3;
  mbedtls_ssl_session *__s;
  mbedtls_ssl_handshake_params *pmVar4;
  bool bVar5;
  
  if (ssl->transform_negotiate != (mbedtls_ssl_transform *)0x0) {
    mbedtls_ssl_transform_free(ssl->transform_negotiate);
  }
  if (ssl->session_negotiate != (mbedtls_ssl_session *)0x0) {
    mbedtls_ssl_session_free(ssl->session_negotiate);
  }
  if (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) {
    mbedtls_ssl_handshake_free(ssl->handshake);
  }
  ppmVar1 = &ssl->session_negotiate;
  if (ssl->transform_negotiate == (mbedtls_ssl_transform *)0x0) {
    pmVar3 = (mbedtls_ssl_transform *)calloc(1,0x130);
    ssl->transform_negotiate = pmVar3;
    bVar5 = pmVar3 == (mbedtls_ssl_transform *)0x0;
  }
  else {
    bVar5 = false;
  }
  __s = *ppmVar1;
  if (__s == (mbedtls_ssl_session *)0x0) {
    __s = (mbedtls_ssl_session *)calloc(1,0x98);
    *ppmVar1 = __s;
  }
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    pmVar4 = (mbedtls_ssl_handshake_params *)calloc(1,0xa98);
    ssl->handshake = pmVar4;
    if ((pmVar4 != (mbedtls_ssl_handshake_params *)0x0 && !bVar5) &&
        __s != (mbedtls_ssl_session *)0x0) goto LAB_00117af1;
  }
  else if ((bool)(~bVar5 & __s != (mbedtls_ssl_session *)0x0)) {
LAB_00117af1:
    memset(__s,0,0x98);
    pmVar3 = ssl->transform_negotiate;
    memset(pmVar3,0,0x130);
    mbedtls_cipher_init(&pmVar3->cipher_ctx_enc);
    mbedtls_cipher_init(&pmVar3->cipher_ctx_dec);
    mbedtls_md_init(&pmVar3->md_ctx_enc);
    mbedtls_md_init(&pmVar3->md_ctx_dec);
    pmVar4 = ssl->handshake;
    memset(pmVar4,0,0xa98);
    mbedtls_md5_init(&pmVar4->fin_md5);
    mbedtls_sha1_init(&pmVar4->fin_sha1);
    mbedtls_md5_starts(&pmVar4->fin_md5);
    mbedtls_sha1_starts(&pmVar4->fin_sha1);
    mbedtls_sha256_init(&pmVar4->fin_sha256);
    mbedtls_sha256_starts(&pmVar4->fin_sha256,0);
    mbedtls_sha512_init(&pmVar4->fin_sha512);
    mbedtls_sha512_starts(&pmVar4->fin_sha512,1);
    pmVar4->update_checksum = ssl_update_checksum_start;
    pmVar4->sig_alg = 2;
    mbedtls_dhm_init(&pmVar4->dhm_ctx);
    mbedtls_ecdh_init(&pmVar4->ecdh_ctx);
    pmVar4->sni_authmode = 3;
    pmVar2 = ssl->conf;
    if ((pmVar2->field_0x174 & 2) == 0) {
      return 0;
    }
    pmVar4 = ssl->handshake;
    pmVar4->alt_transform_out = ssl->transform_out;
    pmVar4->retransmit_state = pmVar2->field_0x174 * '\x02' & 2;
    ssl_set_timer(ssl,0);
    return 0;
  }
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x14c6,"alloc() of ssl sub-contexts failed");
  free(ssl->handshake);
  free(ssl->transform_negotiate);
  free(ssl->session_negotiate);
  ssl->transform_negotiate = (mbedtls_ssl_transform *)0x0;
  *ppmVar1 = (mbedtls_ssl_session *)0x0;
  ssl->handshake = (mbedtls_ssl_handshake_params *)0x0;
  return -0x7f00;
}

Assistant:

static int ssl_handshake_init( mbedtls_ssl_context *ssl )
{
    /* Clear old handshake information if present */
    if( ssl->transform_negotiate )
        mbedtls_ssl_transform_free( ssl->transform_negotiate );
    if( ssl->session_negotiate )
        mbedtls_ssl_session_free( ssl->session_negotiate );
    if( ssl->handshake )
        mbedtls_ssl_handshake_free( ssl->handshake );

    /*
     * Either the pointers are now NULL or cleared properly and can be freed.
     * Now allocate missing structures.
     */
    if( ssl->transform_negotiate == NULL )
    {
        ssl->transform_negotiate = mbedtls_calloc( 1, sizeof(mbedtls_ssl_transform) );
    }

    if( ssl->session_negotiate == NULL )
    {
        ssl->session_negotiate = mbedtls_calloc( 1, sizeof(mbedtls_ssl_session) );
    }

    if( ssl->handshake == NULL )
    {
        ssl->handshake = mbedtls_calloc( 1, sizeof(mbedtls_ssl_handshake_params) );
    }

    /* All pointers should exist and can be directly freed without issue */
    if( ssl->handshake == NULL ||
        ssl->transform_negotiate == NULL ||
        ssl->session_negotiate == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc() of ssl sub-contexts failed" ) );

        mbedtls_free( ssl->handshake );
        mbedtls_free( ssl->transform_negotiate );
        mbedtls_free( ssl->session_negotiate );

        ssl->handshake = NULL;
        ssl->transform_negotiate = NULL;
        ssl->session_negotiate = NULL;

        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    /* Initialize structures */
    mbedtls_ssl_session_init( ssl->session_negotiate );
    ssl_transform_init( ssl->transform_negotiate );
    ssl_handshake_params_init( ssl->handshake );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        ssl->handshake->alt_transform_out = ssl->transform_out;

        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
            ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_PREPARING;
        else
            ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_WAITING;

        ssl_set_timer( ssl, 0 );
    }
#endif

    return( 0 );
}